

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

string * __thiscall
leveldb::log::RandomSkewedString_abi_cxx11_
          (string *__return_storage_ptr__,log *this,int i,Random *rnd)

{
  uint uVar1;
  ulong uVar2;
  string *extraout_RAX;
  string *psVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  uint uVar5;
  string local_38;
  
  NumberString_abi_cxx11_(&local_38,this,i);
  uVar2 = (ulong)*(uint *)CONCAT44(in_register_00000014,i) * 0x41a7;
  uVar4 = (int)(uVar2 >> 0x1f) + ((uint)uVar2 & 0x7fffffff);
  uVar1 = uVar4 + 0x80000001;
  if (-1 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar5 = (int)((ulong)uVar1 * 0x41a7 >> 0x1f) + ((uint)((ulong)uVar1 * 0x41a7) & 0x7fffffff);
  uVar4 = uVar5 + 0x80000001;
  if (-1 < (int)uVar5) {
    uVar4 = uVar5;
  }
  *(uint *)CONCAT44(in_register_00000014,i) = uVar4;
  BigString(__return_storage_ptr__,&local_38,
            (ulong)(~(-1 << ((char)uVar1 + (char)(uVar1 / 0x12) * -0x12 & 0x1fU)) & uVar4));
  psVar3 = (string *)&local_38.field_2;
  if ((string *)local_38._M_dataplus._M_p != psVar3) {
    operator_delete(local_38._M_dataplus._M_p);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static std::string RandomSkewedString(int i, Random* rnd) {
  return BigString(NumberString(i), rnd->Skewed(17));
}